

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O2

EGLSurface glfwGetEGLSurface(GLFWwindow *handle)

{
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x20c) == 0x36002) {
      return *(EGLSurface *)(handle + 0x290);
    }
    code = 0x1000a;
  }
  _glfwInputError(code,(char *)0x0);
  return (EGLSurface)0x0;
}

Assistant:

GLFWAPI EGLSurface glfwGetEGLSurface(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_SURFACE);

    if (window->context.source != GLFW_EGL_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_SURFACE;
    }

    return window->context.egl.surface;
}